

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UFFAtomTypesSectionParser.cpp
# Opt level: O3

void __thiscall
OpenMD::UFFAtomTypesSectionParser::parseLine
          (UFFAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  double dVar3;
  ForceFieldOptions *pFVar4;
  int iVar5;
  AtomType *pAVar6;
  RealType Radius;
  string atomTypeName;
  UFFAdapter uffa;
  StringTokenizer tokenizer;
  string local_f8;
  RealType local_d8;
  RealType local_d0;
  RealType local_c8;
  RealType local_c0;
  RealType local_b8;
  RealType local_b0;
  RealType local_a8;
  RealType local_a0;
  RealType local_98;
  RealType local_90;
  UFFAdapter local_88;
  StringTokenizer local_80;
  
  paVar1 = &local_f8.field_2;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8," ;\t\n\r","");
  StringTokenizer::StringTokenizer(&local_80,line,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  iVar5 = StringTokenizer::countTokens(&local_80);
  if (iVar5 < 0xc) {
    snprintf(painCave.errMsg,2000,"UFFAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(&local_f8,&local_80);
    pAVar6 = ForceField::getAtomType(ff,&local_f8);
    if (pAVar6 == (AtomType *)0x0) {
      snprintf(painCave.errMsg,2000,
               "UFFAtomTypesSectionParser Error: Atom Type [%s] has not been created yet\n",
               local_f8._M_dataplus._M_p);
      painCave.isFatal = 1;
      simError();
    }
    else {
      local_88.at_ = pAVar6;
      local_90 = StringTokenizer::nextTokenAsDouble(&local_80);
      local_98 = StringTokenizer::nextTokenAsDouble(&local_80);
      local_a0 = StringTokenizer::nextTokenAsDouble(&local_80);
      local_a8 = StringTokenizer::nextTokenAsDouble(&local_80);
      local_b0 = StringTokenizer::nextTokenAsDouble(&local_80);
      local_b8 = StringTokenizer::nextTokenAsDouble(&local_80);
      local_c0 = StringTokenizer::nextTokenAsDouble(&local_80);
      local_c8 = StringTokenizer::nextTokenAsDouble(&local_80);
      local_d0 = StringTokenizer::nextTokenAsDouble(&local_80);
      local_d8 = StringTokenizer::nextTokenAsDouble(&local_80);
      Radius = StringTokenizer::nextTokenAsDouble(&local_80);
      pFVar4 = this->options_;
      dVar2 = (pFVar4->EnergyUnitScaling).data_;
      dVar3 = (pFVar4->DistanceUnitScaling).data_;
      UFFAdapter::makeUFF(&local_88,local_90 * dVar3,local_98 * (pFVar4->AngleUnitScaling).data_,
                          local_a0 * dVar3,local_a8 * dVar2,local_b0,
                          local_b8 * (pFVar4->ChargeUnitScaling).data_,local_c0 * dVar2,
                          local_c8 * dVar2,local_d0,local_d8,Radius);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.delim_._M_dataplus._M_p != &local_80.delim_.field_2) {
    operator_delete(local_80.delim_._M_dataplus._M_p,
                    local_80.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.tokenString_._M_dataplus._M_p != &local_80.tokenString_.field_2) {
    operator_delete(local_80.tokenString_._M_dataplus._M_p,
                    local_80.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void UFFAtomTypesSectionParser::parseLine(ForceField& ff,
                                            const std::string& line,
                                            int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    // in UFFAtomTypesSectionParser, a line at least contains 12 tokens:
    // Atom r1 theta0 x1 D1 zeta Z1 Vi Uj Xi Hard Radius

    if (nTokens < 12) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "UFFAtomTypesSectionParser Error: "
               "Not enough tokens at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    } else {
      std::string atomTypeName = tokenizer.nextToken();
      AtomType* atomType       = ff.getAtomType(atomTypeName);

      if (atomType != NULL) {
        UFFAdapter uffa = UFFAdapter(atomType);

        RealType r1     = tokenizer.nextTokenAsDouble();
        RealType theta0 = tokenizer.nextTokenAsDouble();
        RealType x1     = tokenizer.nextTokenAsDouble();
        RealType D1     = tokenizer.nextTokenAsDouble();
        RealType zeta   = tokenizer.nextTokenAsDouble();
        RealType Z1     = tokenizer.nextTokenAsDouble();
        RealType Vi     = tokenizer.nextTokenAsDouble();
        RealType Uj     = tokenizer.nextTokenAsDouble();
        RealType Xi     = tokenizer.nextTokenAsDouble();
        RealType Hard   = tokenizer.nextTokenAsDouble();
        RealType Radius = tokenizer.nextTokenAsDouble();

        r1 *= options_.getDistanceUnitScaling();
        theta0 *= options_.getAngleUnitScaling();
        x1 *= options_.getDistanceUnitScaling();
        D1 *= options_.getEnergyUnitScaling();
        Z1 *= options_.getChargeUnitScaling();
        Vi *= options_.getEnergyUnitScaling();
        Uj *= options_.getEnergyUnitScaling();

        uffa.makeUFF(r1, theta0, x1, D1, zeta, Z1, Vi, Uj, Xi, Hard, Radius);

      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "UFFAtomTypesSectionParser Error: Atom Type [%s]"
                 " has not been created yet\n",
                 atomTypeName.c_str());
        painCave.isFatal = 1;
        simError();
      }
    }
  }